

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Extern> * __thiscall
wabt::interp::RefPtr<wabt::interp::Extern>::operator=
          (RefPtr<wabt::interp::Extern> *this,RefPtr<wabt::interp::Global> *other)

{
  Index local_28;
  RefPtr<wabt::interp::Global> *other_local;
  RefPtr<wabt::interp::Extern> *this_local;
  
  this->obj_ = &other->obj_->super_Extern;
  this->store_ = other->store_;
  if (this->store_ == (Store *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = Store::CopyRoot(this->store_,other->root_index_);
  }
  this->root_index_ = local_28;
  return this;
}

Assistant:

RefPtr<T>& RefPtr<T>::operator=(const RefPtr<U>& other){
  obj_ = other.obj_;
  store_ = other.store_;
  root_index_ = store_ ? store_->CopyRoot(other.root_index_) : 0;
  return *this;
}